

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  Options *pOVar4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1d0;
  string_view local_1c8;
  string_view local_1b8;
  string_view local_1a8;
  Options local_198;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_140;
  string_view local_138;
  string_view local_128;
  string_view local_118;
  Options local_108;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_b0;
  string_view local_a8;
  string_view local_98;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringFieldLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = FieldDescriptor::has_presence(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    Options::Options(&local_68,pOVar4);
    WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_68,false,false,false);
    Options::~Options(&local_68);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_88,"$deprecation$boolean ${$has$capitalized_name$$}$();\n");
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_88[0]);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_b0);
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_98,local_a8,pFVar1,local_b0);
  }
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_108,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_108,false,false,false);
  Options::~Options(&local_108);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"$deprecation$java.lang.String ${$get$capitalized_name$$}$();\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_140);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_128,local_138,pFVar1,local_140);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_198,pOVar4);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,GETTER,&local_198,false,false,false);
  Options::~Options(&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "$deprecation$com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$();\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1b8,local_1c8,pFVar1,local_1d0);
  return;
}

Assistant:

void ImmutableStringFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(variables_,
                   "$deprecation$boolean ${$has$capitalized_name$$}$();\n");
    printer->Annotate("{", "}", descriptor_);
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$java.lang.String ${$get$capitalized_name$$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "$deprecation$com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$();\n");
  printer->Annotate("{", "}", descriptor_);
}